

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O1

ALLEGRO_USTR * al_path_ustr(ALLEGRO_PATH *path,char delim)

{
  ALLEGRO_USTR *us1;
  undefined8 *puVar1;
  ulong uVar2;
  undefined7 in_register_00000031;
  uint uVar3;
  
  us1 = path->full_string;
  al_ustr_assign(us1,path->drive);
  if ((path->segments)._size != 0) {
    uVar3 = 1;
    do {
      puVar1 = (undefined8 *)_al_vector_ref(&path->segments,uVar3 - 1);
      al_ustr_append(us1,(ALLEGRO_USTR *)*puVar1);
      al_ustr_append_chr(us1,(int32_t)CONCAT71(in_register_00000031,delim));
      uVar2 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar2 < (path->segments)._size);
  }
  al_ustr_append(us1,path->filename);
  return path->full_string;
}

Assistant:

const ALLEGRO_USTR *al_path_ustr(const ALLEGRO_PATH *path, char delim)
{
   path_to_ustr(path, delim, path->full_string);
   return path->full_string;
}